

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O2

void __thiscall QPDFJob::UnderOverlay::UnderOverlay(UnderOverlay *this,UnderOverlay *param_1)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer piVar3;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->filename,(string *)&param_1->filename);
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (param_1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (param_1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  (param_1->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__cxx11::string::string((string *)&this->to_nr,(string *)&param_1->to_nr);
  std::__cxx11::string::string((string *)&this->from_nr,(string *)&param_1->from_nr);
  std::__cxx11::string::string((string *)&this->repeat_nr,(string *)&param_1->repeat_nr);
  (this->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = (param_1->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                 super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
  (param_1->pdf)._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = (QPDF *)0x0;
  piVar3 = (param_1->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar3;
  (this->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->to_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar3 = (param_1->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (param_1->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  (this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = piVar3;
  (this->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (param_1->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->from_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar3 = (param_1->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar3;
  (this->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->repeat_pagenos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UnderOverlay(char const* which) :
            which(which),
            to_nr("1-z"),
            from_nr("1-z"),
            repeat_nr("")
        {
        }